

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O1

BrotliDecoderErrorCode
duckdb_brotli::DecodeMetaBlockLength(BrotliDecoderStateInternal *s,BrotliBitReader *br)

{
  byte *pbVar1;
  int iVar2;
  uint64_t uVar3;
  BrotliRunningMetablockHeaderState BVar4;
  uint uVar5;
  ulong uVar6;
  ulong in_RDX;
  uint uVar7;
  bool bVar8;
  
  BVar4 = s->substate_metablock_header;
  do {
    switch(BVar4) {
    case BROTLI_STATE_METABLOCK_HEADER_NONE:
      uVar3 = br->bit_pos_;
      bVar8 = uVar3 == 0;
      if (bVar8) {
        pbVar1 = br->next_in;
        if (pbVar1 != br->last_in) {
          br->val_ = br->val_ | (ulong)*pbVar1;
          br->bit_pos_ = 8;
          br->next_in = pbVar1 + 1;
          uVar3 = 8;
          bVar8 = false;
          goto LAB_01d65cf9;
        }
      }
      else {
LAB_01d65cf9:
        in_RDX = (ulong)((uint)br->val_ & 1);
        br->bit_pos_ = uVar3 - 1;
        br->val_ = br->val_ >> 1;
      }
      if (bVar8) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      s->meta_block_remaining_len = 0;
      *(uint *)&s->field_0x304 = *(uint *)&s->field_0x304 & 0xfffffff8 | (uint)(in_RDX != 0);
      if (in_RDX != 0) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
        goto switchD_01d65cc3_caseD_1;
      }
      BVar4 = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
      goto LAB_01d65e4d;
    case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
switchD_01d65cc3_caseD_1:
      uVar3 = br->bit_pos_;
      bVar8 = uVar3 == 0;
      if (bVar8) {
        pbVar1 = br->next_in;
        if (pbVar1 != br->last_in) {
          br->val_ = br->val_ | (ulong)*pbVar1;
          br->bit_pos_ = 8;
          br->next_in = pbVar1 + 1;
          uVar3 = 8;
          bVar8 = false;
          goto LAB_01d65d85;
        }
      }
      else {
LAB_01d65d85:
        in_RDX = (ulong)((uint)br->val_ & 1);
        br->bit_pos_ = uVar3 - 1;
        br->val_ = br->val_ >> 1;
      }
      if (bVar8) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (in_RDX != 0) goto LAB_01d6615f;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
    case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
      uVar6 = br->bit_pos_;
      bVar8 = uVar6 < 2;
      if (bVar8) {
        pbVar1 = br->next_in;
        if (pbVar1 != br->last_in) {
          br->val_ = br->val_ | (ulong)*pbVar1 << ((byte)uVar6 & 0x3f);
          uVar6 = uVar6 | 8;
          br->bit_pos_ = uVar6;
          br->next_in = pbVar1 + 1;
          bVar8 = false;
          goto LAB_01d65dea;
        }
      }
      else {
LAB_01d65dea:
        in_RDX = (ulong)((uint)br->val_ & 3);
        br->bit_pos_ = uVar6 - 2;
        br->val_ = br->val_ >> 2;
      }
      if (bVar8) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar7 = *(uint *)&s->field_0x304 & 0xfff00fff | (int)in_RDX * 0x1000 + 0x4000U & 0xff000;
      *(uint *)&s->field_0x304 = uVar7;
      s->loop_counter = 0;
      if (in_RDX != 3) {
        s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
        goto switchD_01d65cc3_caseD_3;
      }
      *(uint *)&s->field_0x304 = uVar7 | 4;
      BVar4 = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
LAB_01d65e4d:
      s->substate_metablock_header = BVar4;
      break;
    case BROTLI_STATE_METABLOCK_HEADER_SIZE:
      goto switchD_01d65cc3_caseD_3;
    case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
      goto switchD_01d65cc3_caseD_4;
    case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
      uVar3 = br->bit_pos_;
      bVar8 = uVar3 == 0;
      if (bVar8) {
        pbVar1 = br->next_in;
        if (pbVar1 != br->last_in) {
          br->val_ = br->val_ | (ulong)*pbVar1;
          br->bit_pos_ = 8;
          br->next_in = pbVar1 + 1;
          uVar3 = 8;
          bVar8 = false;
          goto LAB_01d65fe5;
        }
      }
      else {
LAB_01d65fe5:
        in_RDX = (ulong)((uint)br->val_ & 1);
        br->bit_pos_ = uVar3 - 1;
        br->val_ = br->val_ >> 1;
      }
      if (bVar8) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (in_RDX != 0) {
        return BROTLI_DECODER_ERROR_FORMAT_RESERVED;
      }
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
      in_RDX = 0;
    case BROTLI_STATE_METABLOCK_HEADER_BYTES:
      uVar6 = br->bit_pos_;
      bVar8 = uVar6 < 2;
      if (bVar8) {
        pbVar1 = br->next_in;
        if (pbVar1 != br->last_in) {
          br->val_ = br->val_ | (ulong)*pbVar1 << ((byte)uVar6 & 0x3f);
          uVar6 = uVar6 | 8;
          br->bit_pos_ = uVar6;
          br->next_in = pbVar1 + 1;
          bVar8 = false;
          goto LAB_01d66053;
        }
      }
      else {
LAB_01d66053:
        in_RDX = (ulong)((uint)br->val_ & 3);
        br->bit_pos_ = uVar6 - 2;
        br->val_ = br->val_ >> 2;
      }
      if (bVar8) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (in_RDX == 0) goto LAB_01d6615f;
      *(uint *)&s->field_0x304 =
           *(uint *)&s->field_0x304 & 0xfff00fff | ((uint)in_RDX & 0xff) << 0xc;
      s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
switchD_01d65cc3_caseD_7:
      uVar7 = s->loop_counter;
      if ((int)(*(uint *)&s->field_0x304 >> 0xc & 0xff) <= (int)uVar7) goto LAB_01d66159;
      iVar2 = uVar7 * 8;
      goto LAB_01d660c5;
    case BROTLI_STATE_METABLOCK_HEADER_METADATA:
      goto switchD_01d65cc3_caseD_7;
    default:
      return BROTLI_DECODER_ERROR_UNREACHABLE;
    }
  } while( true );
  while( true ) {
    uVar7 = uVar7 + 1;
    uVar5 = *(uint *)&s->field_0x304 >> 0xc & 0xff;
    if (((uVar7 == uVar5) && (1 < uVar5)) && (in_RDX == 0)) {
      return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE;
    }
    s->meta_block_remaining_len =
         s->meta_block_remaining_len | (uint)(in_RDX << ((byte)iVar2 & 0x3f));
    iVar2 = iVar2 + 8;
    if ((int)(*(uint *)&s->field_0x304 >> 0xc & 0xff) <= (int)uVar7) break;
LAB_01d660c5:
    uVar6 = br->bit_pos_;
    bVar8 = uVar6 < 8;
    if (bVar8) {
      pbVar1 = br->next_in;
      if (pbVar1 != br->last_in) {
        br->val_ = br->val_ | (ulong)*pbVar1 << ((byte)uVar6 & 0x3f);
        uVar6 = uVar6 | 8;
        br->bit_pos_ = uVar6;
        br->next_in = pbVar1 + 1;
        bVar8 = false;
        goto LAB_01d660f9;
      }
    }
    else {
LAB_01d660f9:
      in_RDX = br->val_ & 0xff;
      br->bit_pos_ = uVar6 - 8;
      br->val_ = br->val_ >> 8;
    }
    if (bVar8) goto LAB_01d66175;
  }
  goto LAB_01d66159;
switchD_01d65cc3_caseD_3:
  uVar7 = s->loop_counter;
  if ((int)uVar7 < (int)(*(uint *)&s->field_0x304 >> 0xc & 0xff)) {
    iVar2 = uVar7 * 4;
    do {
      uVar6 = br->bit_pos_;
      bVar8 = uVar6 < 4;
      if (bVar8) {
        pbVar1 = br->next_in;
        if (pbVar1 != br->last_in) {
          br->val_ = br->val_ | (ulong)*pbVar1 << ((byte)uVar6 & 0x3f);
          uVar6 = uVar6 | 8;
          br->bit_pos_ = uVar6;
          br->next_in = pbVar1 + 1;
          bVar8 = false;
          goto LAB_01d65ebe;
        }
      }
      else {
LAB_01d65ebe:
        in_RDX = (ulong)((uint)br->val_ & 0xf);
        br->bit_pos_ = uVar6 - 4;
        br->val_ = br->val_ >> 4;
      }
      if (bVar8) {
LAB_01d66175:
        s->loop_counter = uVar7;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar7 = uVar7 + 1;
      uVar5 = *(uint *)&s->field_0x304 >> 0xc & 0xff;
      if (((uVar7 == uVar5) && (4 < uVar5)) && (in_RDX == 0)) {
        return BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE;
      }
      s->meta_block_remaining_len =
           s->meta_block_remaining_len | (uint)(in_RDX << ((byte)iVar2 & 0x3f));
      iVar2 = iVar2 + 4;
    } while ((int)uVar7 < (int)(*(uint *)&s->field_0x304 >> 0xc & 0xff));
  }
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
switchD_01d65cc3_caseD_4:
  if ((s->field_0x304 & 1) != 0) goto LAB_01d66159;
  uVar3 = br->bit_pos_;
  bVar8 = uVar3 == 0;
  if (bVar8) {
    pbVar1 = br->next_in;
    if (pbVar1 != br->last_in) {
      br->val_ = br->val_ | (ulong)*pbVar1;
      br->bit_pos_ = 8;
      br->next_in = pbVar1 + 1;
      uVar3 = 8;
      bVar8 = false;
      goto LAB_01d65f71;
    }
  }
  else {
LAB_01d65f71:
    in_RDX = (ulong)((uint)br->val_ & 1);
    br->bit_pos_ = uVar3 - 1;
    br->val_ = br->val_ >> 1;
  }
  if (bVar8) {
    return BROTLI_DECODER_NEEDS_MORE_INPUT;
  }
  *(uint *)&s->field_0x304 = (*(uint *)&s->field_0x304 & 0xfffffffd) + (uint)(in_RDX != 0) * 2;
LAB_01d66159:
  s->meta_block_remaining_len = s->meta_block_remaining_len + 1;
LAB_01d6615f:
  s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
  return BROTLI_DECODER_SUCCESS;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE DecodeMetaBlockLength(BrotliDecoderState *s, BrotliBitReader *br) {
	brotli_reg_t bits;
	int i;
	for (;;) {
		switch (s->substate_metablock_header) {
		case BROTLI_STATE_METABLOCK_HEADER_NONE:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->is_last_metablock = bits ? 1 : 0;
			s->meta_block_remaining_len = 0;
			s->is_uncompressed = 0;
			s->is_metadata = 0;
			if (!s->is_last_metablock) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
				break;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_EMPTY;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_EMPTY:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
				return BROTLI_DECODER_SUCCESS;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NIBBLES;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_NIBBLES:
			if (!BrotliSafeReadBits(br, 2, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->size_nibbles = (uint8_t)(bits + 4);
			s->loop_counter = 0;
			if (bits == 3) {
				s->is_metadata = 1;
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_RESERVED;
				break;
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_SIZE;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_SIZE:
			i = s->loop_counter;
			for (; i < (int)s->size_nibbles; ++i) {
				if (!BrotliSafeReadBits(br, 4, &bits)) {
					s->loop_counter = i;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				if (i + 1 == (int)s->size_nibbles && s->size_nibbles > 4 && bits == 0) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE);
				}
				s->meta_block_remaining_len |= (int)(bits << (i * 4));
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_UNCOMPRESSED:
			if (!s->is_last_metablock) {
				if (!BrotliSafeReadBits(br, 1, &bits)) {
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				s->is_uncompressed = bits ? 1 : 0;
			}
			++s->meta_block_remaining_len;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
			return BROTLI_DECODER_SUCCESS;

		case BROTLI_STATE_METABLOCK_HEADER_RESERVED:
			if (!BrotliSafeReadBits(br, 1, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits != 0) {
				return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_RESERVED);
			}
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_BYTES;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_BYTES:
			if (!BrotliSafeReadBits(br, 2, &bits)) {
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			if (bits == 0) {
				s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
				return BROTLI_DECODER_SUCCESS;
			}
			s->size_nibbles = (uint8_t)bits;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_METADATA;
			/* Fall through. */

		case BROTLI_STATE_METABLOCK_HEADER_METADATA:
			i = s->loop_counter;
			for (; i < (int)s->size_nibbles; ++i) {
				if (!BrotliSafeReadBits(br, 8, &bits)) {
					s->loop_counter = i;
					return BROTLI_DECODER_NEEDS_MORE_INPUT;
				}
				if (i + 1 == (int)s->size_nibbles && s->size_nibbles > 1 && bits == 0) {
					return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_META_NIBBLE);
				}
				s->meta_block_remaining_len |= (int)(bits << (i * 8));
			}
			++s->meta_block_remaining_len;
			s->substate_metablock_header = BROTLI_STATE_METABLOCK_HEADER_NONE;
			return BROTLI_DECODER_SUCCESS;

		default:
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE); /* COV_NF_LINE */
		}
	}
}